

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignedsuperblockheap.h
# Opt level: O2

void * __thiscall
Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>::malloc
          (SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource> *this,size_t __size)

{
  DLList *pDVar1;
  Entry *pEVar2;
  Entry *e;
  Entry *pEVar3;
  
  pDVar1 = &this->_freeSuperblocks;
  pEVar3 = (this->_freeSuperblocks).head.next;
  if (pEVar3 == &pDVar1->head) {
    pEVar3 = (Entry *)HL::
                      ExactlyOneHeap<HL::LockedHeap<HL::SpinLockType,_Hoard::AlignedMmapInstance<262144UL>_>_>
                      ::malloc((ExactlyOneHeap<HL::LockedHeap<HL::SpinLockType,_Hoard::AlignedMmapInstance<262144UL>_>_>
                                *)this,0x40000);
    if (pEVar3 == (Entry *)0x0) {
      return (void *)0x0;
    }
    pEVar2 = (this->_freeSuperblocks).head.next;
    pEVar3->prev = &pDVar1->head;
    pEVar3->next = pEVar2;
    (this->_freeSuperblocks).head.next = pEVar3;
    pEVar2->prev = pEVar3;
  }
  if (pEVar3 == &pDVar1->head) {
    return (void *)0x0;
  }
  pEVar2 = pEVar3->next;
  (this->_freeSuperblocks).head.next = pEVar2;
  pEVar2->prev = &pDVar1->head;
  return pEVar3;
}

Assistant:

void * malloc (size_t) {
      if (_freeSuperblocks.isEmpty()) {
	// Get more memory.
	void * ptr = _superblockSource.malloc (ChunksToGrab * SuperblockSize);
	if (!ptr) {
	  return nullptr;
	}
	char * p = (char *) ptr;
	for (int i = 0; i < ChunksToGrab; i++) {
	  _freeSuperblocks.insert ((DLList::Entry *) p);
	  p += SuperblockSize;
	}
      }
      return _freeSuperblocks.get();
    }